

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int i2c_write_i2c_block_data(uint handle,uint reg,char *buf,uint count)

{
  int iVar1;
  gpioExtent_t *in_RDX;
  int in_ESI;
  gpioExtent_t ext [1];
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  
  iVar1 = pigpio_command_ext(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                             in_stack_ffffffffffffffd8,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,0,
                             in_RDX,in_ESI);
  return iVar1;
}

Assistant:

int i2c_write_i2c_block_data(
   unsigned handle, unsigned reg, char *buf, unsigned count)
{
   gpioExtent_t ext[1];

   /*
   p1=handle
   p2=reg
   p3=count
   ## extension ##
   char buf[count]
   */

   ext[0].size = count;
   ext[0].ptr = buf;

   return pigpio_command_ext
      (gPigCommand, PI_CMD_I2CWI, handle, reg, count, 1, ext, 1);
}